

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_SetConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FStrifeDialogueNode **ppFVar1;
  AActor *pAVar2;
  undefined1 local_50 [8];
  FActorIterator iterator;
  FStrifeDialogueNode *node;
  int dlg_index;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  node._4_4_ = -1;
  iterator.id = 0;
  iterator._12_4_ = 0;
  if (arg1 != 0) {
    node._4_4_ = GetConversation(arg1);
    if (node._4_4_ == -1) {
      return 0;
    }
    ppFVar1 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                        (&StrifeDialogues,(long)node._4_4_);
    iterator._8_8_ = *ppFVar1;
  }
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->ConversationRoot = node._4_4_;
      it->Conversation = (FStrifeDialogueNode *)iterator._8_8_;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_50,arg0);
    while (pAVar2 = FActorIterator::Next((FActorIterator *)local_50), pAVar2 != (AActor *)0x0) {
      pAVar2->ConversationRoot = node._4_4_;
      pAVar2->Conversation = (FStrifeDialogueNode *)iterator._8_8_;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetConversation)
// Thing_SetConversation (tid, dlg_id)
{
	int dlg_index = -1;
	FStrifeDialogueNode *node = NULL;

	if (arg1 != 0)
	{
		dlg_index = GetConversation(arg1);	
		if (dlg_index == -1) return false;
		node = StrifeDialogues[dlg_index];
	}

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		while ((it = iterator.Next()) != NULL)
		{
			it->ConversationRoot = dlg_index;
			it->Conversation = node;
		}
	}
	else if (it)
	{
		it->ConversationRoot = dlg_index;
		it->Conversation = node;
	}
	return true;
}